

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

int Ivy_FraigSetActivityFactors_rec(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,int LevelMin,int LevelMax)

{
  sat_solver *psVar1;
  Ivy_Obj_t *pIVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0xa2d,
                  "int Ivy_FraigSetActivityFactors_rec(Ivy_FraigMan_t *, Ivy_Obj_t *, int, int)");
  }
  iVar5 = (int)pObj->pNextFan0;
  if (iVar5 != 0) {
    iVar4 = p->pManFraig->nTravIds;
    iVar7 = 0;
    if (pObj->TravId != iVar4) {
      pObj->TravId = iVar4;
      uVar3 = *(uint *)&pObj->field_0x8 >> 0xb;
      iVar4 = uVar3 - LevelMin;
      iVar7 = 0;
      if ((*(uint *)&pObj->field_0x8 & 0xf) != 1 && ((uint)LevelMin <= uVar3 && iVar4 != 0)) {
        psVar1 = p->pSat;
        psVar1->factors[iVar5] =
             ((double)iVar4 * p->pParams->dActConeBumpMax) / (double)(LevelMax - LevelMin);
        uVar3 = (psVar1->act_vars).cap;
        if ((psVar1->act_vars).size == uVar3) {
          iVar4 = (uVar3 >> 1) * 3;
          if ((int)uVar3 < 4) {
            iVar4 = uVar3 * 2;
          }
          piVar6 = (psVar1->act_vars).ptr;
          if (piVar6 == (int *)0x0) {
            piVar6 = (int *)malloc((long)iVar4 << 2);
          }
          else {
            piVar6 = (int *)realloc(piVar6,(long)iVar4 << 2);
          }
          (psVar1->act_vars).ptr = piVar6;
          if (piVar6 == (int *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)(psVar1->act_vars).cap * 9.5367431640625e-07,
                   (double)iVar4 * 9.5367431640625e-07);
            fflush(_stdout);
          }
          (psVar1->act_vars).cap = iVar4;
        }
        iVar4 = (psVar1->act_vars).size;
        (psVar1->act_vars).size = iVar4 + 1;
        (psVar1->act_vars).ptr[iVar4] = iVar5;
        pIVar2 = pObj->pNextFan1;
        if (pIVar2->TravId < 1) {
          iVar7 = 1;
        }
        else {
          lVar8 = 0;
          iVar7 = 0;
          do {
            iVar5 = Ivy_FraigSetActivityFactors_rec
                              (p,(Ivy_Obj_t *)
                                 (*(ulong *)(*(long *)&pIVar2->field_0x8 + lVar8 * 8) &
                                 0xfffffffffffffffe),LevelMin,LevelMax);
            iVar7 = iVar7 + iVar5;
            lVar8 = lVar8 + 1;
          } while (lVar8 < pIVar2->TravId);
          iVar7 = iVar7 + 1;
        }
      }
    }
    return iVar7;
  }
  __assert_fail("Ivy_ObjSatNum(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0xa2e,
                "int Ivy_FraigSetActivityFactors_rec(Ivy_FraigMan_t *, Ivy_Obj_t *, int, int)");
}

Assistant:

int Ivy_FraigSetActivityFactors_rec( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, int LevelMin, int LevelMax )
{
    Vec_Ptr_t * vFanins;
    Ivy_Obj_t * pFanin;
    int i, Counter = 0;
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjSatNum(pObj) );
    // skip visited variables
    if ( Ivy_ObjIsTravIdCurrent(p->pManFraig, pObj) )
        return 0;
    Ivy_ObjSetTravIdCurrent(p->pManFraig, pObj);
    // add the PI to the list
    if ( pObj->Level <= (unsigned)LevelMin || Ivy_ObjIsPi(pObj) )
        return 0;
    // set the factor of this variable
    // (LevelMax-LevelMin) / (pObj->Level-LevelMin) = p->pParams->dActConeBumpMax / ThisBump
    p->pSat->factors[Ivy_ObjSatNum(pObj)] = p->pParams->dActConeBumpMax * (pObj->Level - LevelMin)/(LevelMax - LevelMin);
    veci_push(&p->pSat->act_vars, Ivy_ObjSatNum(pObj));
    // explore the fanins
    vFanins = Ivy_ObjFaninVec( pObj );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, i )
        Counter += Ivy_FraigSetActivityFactors_rec( p, Ivy_Regular(pFanin), LevelMin, LevelMax );
    return 1 + Counter;
}